

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_block.cpp
# Opt level: O2

int CfdGetBlockHeaderData
              (void *handle,void *block_handle,uint32_t *version,char **prev_block_hash,
              char **merkle_root_hash,uint32_t *time,uint32_t *bits,uint32_t *nonce)

{
  char *pcVar1;
  char *pcVar2;
  CfdException *pCVar3;
  allocator local_f9;
  void *local_f8;
  char *work_prev_block_hash;
  undefined8 local_e8;
  BlockHeader local_e0;
  BlockHeader header;
  
  work_prev_block_hash = (char *)0x0;
  local_e8 = 0;
  local_f8 = handle;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&header,"BlockOpe",(allocator *)&local_e0);
  cfd::capi::CheckBuffer(block_handle,(string *)&header);
  std::__cxx11::string::~string((string *)&header);
  cfd::core::BlockHeader::BlockHeader(&header);
  if (*(Block **)((long)block_handle + 0x18) == (Block *)0x0) {
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_e0,"Invalid handle state. block is null",&local_f9);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)&local_e0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(int *)((long)block_handle + 0x10) < 3) {
    cfd::core::Block::GetBlockHeader(&local_e0,*(Block **)((long)block_handle + 0x18));
    cfd::core::BlockHeader::operator=(&header,&local_e0);
    cfd::core::BlockHeader::~BlockHeader(&local_e0);
    if (prev_block_hash == (char **)0x0) {
      pcVar1 = (char *)0x0;
    }
    else {
      cfd::core::BlockHash::GetHex_abi_cxx11_((string *)&local_e0,&header.prev_block_hash);
      pcVar1 = cfd::capi::CreateString((string *)&local_e0);
      work_prev_block_hash = pcVar1;
      std::__cxx11::string::~string((string *)&local_e0);
    }
    if (merkle_root_hash == (char **)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      cfd::core::BlockHash::GetHex_abi_cxx11_((string *)&local_e0,&header.merkle_root_hash);
      pcVar2 = cfd::capi::CreateString((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    if (version != (uint32_t *)0x0) {
      *version = header.version;
    }
    if (prev_block_hash != (char **)0x0) {
      *prev_block_hash = pcVar1;
    }
    if (merkle_root_hash != (char **)0x0) {
      *merkle_root_hash = pcVar2;
    }
    if (time != (uint32_t *)0x0) {
      *time = header.time;
    }
    if (bits != (uint32_t *)0x0) {
      *bits = header.bits;
    }
    if (nonce != (uint32_t *)0x0) {
      *nonce = header.nonce;
    }
    cfd::core::BlockHeader::~BlockHeader(&header);
    return 0;
  }
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_e0,"Elements is not supported.",&local_f9);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_e0);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetBlockHeaderData(
    void* handle, void* block_handle, uint32_t* version,
    char** prev_block_hash, char** merkle_root_hash, uint32_t* time,
    uint32_t* bits, uint32_t* nonce) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_prev_block_hash = nullptr;
  char* work_merkle_root_hash = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(block_handle, kPrefixBlock);
    CfdCapiBlockData* block_data =
        static_cast<CfdCapiBlockData*>(block_handle);

    BlockHeader header;
    if (block_data->block == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. block is null");
    } else if (block_data->net_type <= NetType::kRegtest) {
      header = block_data->block->GetBlockHeader();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (prev_block_hash != nullptr) {
      work_prev_block_hash = CreateString(header.prev_block_hash.GetHex());
    }
    if (merkle_root_hash != nullptr) {
      work_merkle_root_hash = CreateString(header.merkle_root_hash.GetHex());
    }

    if (version != nullptr) *version = header.version;
    if (prev_block_hash != nullptr) {
      *prev_block_hash = work_prev_block_hash;
    }
    if (merkle_root_hash != nullptr) {
      *merkle_root_hash = work_merkle_root_hash;
    }
    if (time != nullptr) *time = header.time;
    if (bits != nullptr) *bits = header.bits;
    if (nonce != nullptr) *nonce = header.nonce;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_prev_block_hash, &work_merkle_root_hash);
  return result;
}